

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O3

Matrix * MatrixNormalize(Matrix mat)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Matrix *in_RDI;
  float fVar4;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar5 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 in_stack_00000008 [16];
  undefined1 in_stack_00000018 [16];
  undefined1 in_stack_00000028 [16];
  undefined1 in_stack_00000038 [16];
  
  fVar4 = in_stack_00000008._0_4_;
  fVar6 = in_stack_00000008._4_4_;
  fVar7 = in_stack_00000008._8_4_;
  fVar8 = in_stack_00000008._12_4_;
  fVar9 = in_stack_00000018._0_4_;
  fVar11 = in_stack_00000018._4_4_;
  fVar12 = in_stack_00000018._8_4_;
  fVar13 = in_stack_00000018._12_4_;
  fVar18 = in_stack_00000028._4_4_;
  fVar19 = in_stack_00000028._8_4_;
  fVar20 = in_stack_00000028._12_4_;
  fVar14 = in_stack_00000038._0_4_;
  fVar15 = in_stack_00000038._4_4_;
  fVar16 = in_stack_00000038._8_4_;
  fVar17 = in_stack_00000038._12_4_;
  fVar10 = in_stack_00000028._0_4_;
  fVar4 = fVar17 * fVar19 * fVar4 * fVar11 +
          (((fVar7 * fVar9 * fVar18 * fVar17 +
            fVar6 * fVar12 * fVar10 * fVar17 +
            (((fVar9 * fVar6 * fVar20 * fVar16 +
              fVar13 * fVar4 * fVar18 * fVar16 +
              (((fVar11 * fVar8 * fVar10 * fVar16 +
                fVar15 * fVar12 * fVar4 * fVar20 +
                (((fVar19 * fVar8 * fVar9 * fVar15 +
                  fVar7 * fVar13 * fVar10 * fVar15 +
                  (((fVar11 * fVar7 * fVar20 * fVar14 +
                    fVar19 * fVar6 * fVar13 * fVar14 +
                    ((fVar18 * fVar12 * fVar8 * fVar14 - fVar18 * fVar7 * fVar13 * fVar14) -
                    fVar19 * fVar11 * fVar8 * fVar14)) - fVar20 * fVar6 * fVar12 * fVar14) -
                  fVar12 * fVar8 * fVar10 * fVar15)) - fVar19 * fVar13 * fVar4 * fVar15) -
                fVar20 * fVar7 * fVar9 * fVar15)) - fVar6 * fVar13 * fVar10 * fVar16) -
              fVar8 * fVar9 * fVar18 * fVar16)) - fVar16 * fVar20 * fVar4 * fVar11) -
            fVar11 * fVar7 * fVar10 * fVar17)) - fVar18 * fVar12 * fVar4 * fVar17) -
          fVar19 * fVar9 * fVar6 * fVar17);
  auVar5._4_4_ = fVar4;
  auVar5._0_4_ = fVar4;
  auVar5._8_4_ = fVar4;
  auVar5._12_4_ = fVar4;
  auVar5 = divps(in_stack_00000008,auVar5);
  in_RDI->m0 = (float)auVar5._0_4_;
  in_RDI->m4 = (float)auVar5._4_4_;
  in_RDI->m8 = (float)auVar5._8_4_;
  in_RDI->m12 = (float)auVar5._12_4_;
  auVar1._4_4_ = fVar4;
  auVar1._0_4_ = fVar4;
  auVar1._8_4_ = fVar4;
  auVar1._12_4_ = fVar4;
  auVar5 = divps(in_stack_00000018,auVar1);
  in_RDI->m1 = (float)auVar5._0_4_;
  in_RDI->m5 = (float)auVar5._4_4_;
  in_RDI->m9 = (float)auVar5._8_4_;
  in_RDI->m13 = (float)auVar5._12_4_;
  auVar2._4_4_ = fVar4;
  auVar2._0_4_ = fVar4;
  auVar2._8_4_ = fVar4;
  auVar2._12_4_ = fVar4;
  auVar5 = divps(in_stack_00000028,auVar2);
  in_RDI->m2 = (float)auVar5._0_4_;
  in_RDI->m6 = (float)auVar5._4_4_;
  in_RDI->m10 = (float)auVar5._8_4_;
  in_RDI->m14 = (float)auVar5._12_4_;
  auVar3._4_4_ = fVar4;
  auVar3._0_4_ = fVar4;
  auVar3._8_4_ = fVar4;
  auVar3._12_4_ = fVar4;
  auVar5 = divps(in_stack_00000038,auVar3);
  in_RDI->m3 = (float)auVar5._0_4_;
  in_RDI->m7 = (float)auVar5._4_4_;
  in_RDI->m11 = (float)auVar5._8_4_;
  in_RDI->m15 = (float)auVar5._12_4_;
  return in_RDI;
}

Assistant:

RMDEF Matrix MatrixNormalize(Matrix mat)
{
    Matrix result = { 0 };

    float det = MatrixDeterminant(mat);

    result.m0 = mat.m0/det;
    result.m1 = mat.m1/det;
    result.m2 = mat.m2/det;
    result.m3 = mat.m3/det;
    result.m4 = mat.m4/det;
    result.m5 = mat.m5/det;
    result.m6 = mat.m6/det;
    result.m7 = mat.m7/det;
    result.m8 = mat.m8/det;
    result.m9 = mat.m9/det;
    result.m10 = mat.m10/det;
    result.m11 = mat.m11/det;
    result.m12 = mat.m12/det;
    result.m13 = mat.m13/det;
    result.m14 = mat.m14/det;
    result.m15 = mat.m15/det;

    return result;
}